

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputmethod.cpp
# Opt level: O2

void __thiscall QInputMethod::setInputItemTransform(QInputMethod *this,QTransform *transform)

{
  bool bVar1;
  long lVar2;
  QTransform *this_00;
  byte bVar3;
  
  bVar3 = 0;
  this_00 = (QTransform *)(*(long *)&this->field_0x8 + 0x78);
  bVar1 = QTransform::operator==(this_00,transform);
  if (bVar1) {
    return;
  }
  for (lVar2 = 0x4a; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined1 *)this_00->m_matrix[0] = *(undefined1 *)transform->m_matrix[0];
    transform = (QTransform *)((long)transform + (ulong)bVar3 * -2 + 1);
    this_00 = (QTransform *)((long)this_00 + (ulong)bVar3 * -2 + 1);
  }
  cursorRectangleChanged(this);
  anchorRectangleChanged(this);
  return;
}

Assistant:

void QInputMethod::setInputItemTransform(const QTransform &transform)
{
    Q_D(QInputMethod);
    if (d->inputItemTransform == transform)
        return;

    d->inputItemTransform = transform;
    emit cursorRectangleChanged();
    emit anchorRectangleChanged();
}